

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::CLUFactor<double>::vSolveUright
          (CLUFactor<double> *this,double *vec,int *vidx,double *rhs,int *ridx,int rn,double eps)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  pointer pdVar6;
  int *piVar7;
  int *piVar8;
  pointer pdVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int *piVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  double *pdVar24;
  double dVar25;
  double dVar26;
  
  if (rn < 1) {
    iVar11 = 0;
  }
  else {
    piVar2 = (this->row).orig;
    piVar3 = (this->row).perm;
    piVar4 = (this->col).orig;
    piVar5 = (this->u).col.idx;
    pdVar6 = (this->u).col.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->u).col.len;
    piVar8 = (this->u).col.start;
    pdVar9 = (this->diag).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar11 = 0;
    do {
      iVar14 = *ridx;
      uVar17 = rn - 1;
      iVar21 = ridx[(long)rn + -1];
      iVar22 = 1;
      iVar23 = 0;
      if (3 < rn) {
        iVar23 = 0;
        do {
          iVar1 = ridx[iVar22];
          iVar18 = ridx[(long)iVar22 + 1];
          piVar15 = ridx + iVar23;
          if (iVar18 < iVar1) {
            iVar23 = iVar22;
            iVar18 = iVar1;
            if (iVar1 <= iVar21) goto LAB_001e0c0e;
          }
          else {
            if (iVar18 <= iVar21) goto LAB_001e0c0e;
            iVar23 = iVar22 + 1;
          }
          *piVar15 = iVar18;
          iVar22 = iVar23 * 2 + 1;
        } while (iVar22 < (int)(rn - 2U));
      }
      if ((iVar22 < (int)uVar17) && (iVar21 < ridx[iVar22])) {
        ridx[iVar23] = ridx[iVar22];
        iVar23 = iVar22;
      }
      piVar15 = ridx + iVar23;
LAB_001e0c0e:
      *piVar15 = iVar21;
      iVar22 = piVar2[iVar14];
      dVar25 = pdVar9[iVar22] * rhs[iVar22];
      rhs[iVar22] = 0.0;
      if (eps < ABS(dVar25)) {
        iVar22 = piVar4[iVar14];
        vidx[iVar11] = iVar22;
        vec[iVar22] = dVar25;
        iVar21 = piVar7[iVar22];
        if (0 < iVar21) {
          iVar22 = piVar8[iVar22];
          piVar15 = piVar5 + iVar22;
          pdVar24 = pdVar6 + iVar22;
          do {
            iVar22 = *piVar15;
            dVar26 = rhs[iVar22];
            if ((dVar26 != 0.0) || (NAN(dVar26))) {
              dVar26 = dVar26 - *pdVar24 * dVar25;
              rhs[iVar22] = (double)(-(ulong)(dVar26 == 0.0) & 0x2b2bff2ee48e0530) + dVar26;
            }
            else {
              dVar26 = *pdVar24 * -dVar25;
              if (eps < ABS(dVar26)) {
                rhs[iVar22] = dVar26;
                iVar22 = piVar3[iVar22];
                uVar13 = uVar17;
                if (0 < (int)uVar17) {
                  do {
                    uVar19 = uVar13 - 1;
                    uVar12 = uVar19 >> 1;
                    if (iVar22 <= ridx[uVar12]) break;
                    ridx[uVar13] = ridx[uVar12];
                    uVar13 = uVar12;
                  } while (1 < uVar19);
                }
                uVar17 = uVar17 + 1;
                ridx[(int)uVar13] = iVar22;
              }
            }
            piVar15 = piVar15 + 1;
            pdVar24 = pdVar24 + 1;
            bVar10 = 1 < iVar21;
            iVar21 = iVar21 + -1;
          } while (bVar10);
        }
        iVar11 = iVar11 + 1;
        if ((double)iVar14 * 0.2 < (double)(int)uVar17) {
          lVar20 = (long)*ridx;
          if ((long)*ridx < 0) {
            return iVar11;
          }
          do {
            iVar22 = piVar2[lVar20];
            dVar25 = pdVar9[iVar22] * rhs[iVar22];
            rhs[iVar22] = 0.0;
            if (eps < ABS(dVar25)) {
              iVar22 = piVar4[lVar20];
              lVar16 = (long)iVar11;
              iVar11 = iVar11 + 1;
              vidx[lVar16] = iVar22;
              vec[iVar22] = dVar25;
              iVar14 = piVar7[iVar22];
              if (0 < iVar14) {
                lVar16 = (long)piVar8[iVar22] << 2;
                iVar14 = iVar14 + 1;
                do {
                  iVar22 = *(int *)((long)piVar5 + lVar16);
                  rhs[iVar22] = rhs[iVar22] - *(double *)((long)pdVar6 + lVar16 * 2) * dVar25;
                  lVar16 = lVar16 + 4;
                  iVar14 = iVar14 + -1;
                } while (1 < iVar14);
              }
            }
            bVar10 = 0 < lVar20;
            lVar20 = lVar20 + -1;
          } while (bVar10);
          return iVar11;
        }
      }
      rn = uVar17;
    } while (0 < (int)uVar17);
  }
  return iVar11;
}

Assistant:

int CLUFactor<R>::vSolveUright(R* vec, int* vidx,
                               R* rhs, int* ridx, int rn, R eps)
{
   int i, j, k, r, c, n;
   int* rorig, *corig;
   int* rperm;
   int* cidx, *clen, *cbeg;
   R* cval;
   R x, y;

   int* idx;
   R* val;

   rorig = row.orig;
   corig = col.orig;
   rperm = row.perm;

   cidx = u.col.idx;
   cval = u.col.val.data();
   clen = u.col.len;
   cbeg = u.col.start;

   n = 0;

   while(rn > 0)
   {
      /*      Find nonzero with highest permuted row index and setup i and r
       */
      i = deQueueMax(ridx, &rn);
      assert(i >= 0 && i < thedim);
      r = rorig[i];
      assert(r >= 0 && r < thedim);

      x = diag[r] * rhs[r];
      rhs[r] = 0;

      if(isNotZero(x, eps))
      {
         c = corig[i];
         assert(c >= 0 && c < thedim);
         vidx[n++] = c;
         vec[c] = x;
         val = &cval[cbeg[c]];
         idx = &cidx[cbeg[c]];
         j = clen[c];

         while(j-- > 0)
         {
            assert(*idx >= 0 && *idx < thedim);
            k = *idx++;
            assert(k >= 0 && k < thedim);
            y = rhs[k];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[k] = y;
                  enQueueMax(ridx, &rn, rperm[k]);
               }
            }
            else
            {
               y -= x * (*val++);
               y += (y == 0) ? SOPLEX_FACTOR_MARKER : 0;
               rhs[k] = y;
            }
         }

         if(rn > i * verySparseFactor4right)
         {
            /* continue with dense case */
            for(i = *ridx; i >= 0; --i)
            {
               r = rorig[i];
               assert(r >= 0 && r < thedim);
               x = diag[r] * rhs[r];
               rhs[r] = 0;

               if(isNotZero(x, eps))
               {
                  c = corig[i];
                  assert(c >= 0 && c < thedim);
                  vidx[n++] = c;
                  vec[c] = x;
                  val = &cval[cbeg[c]];
                  idx = &cidx[cbeg[c]];
                  j = clen[c];

                  while(j-- > 0)
                  {
                     assert(*idx >= 0 && *idx < thedim);
                     rhs[*idx++] -= x * (*val++);
                  }
               }
            }

            break;
         }
      }
   }

   return n;
}